

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall
ImVector<ImGuiKeyRoutingData>::push_back(ImVector<ImGuiKeyRoutingData> *this,ImGuiKeyRoutingData *v)

{
  undefined8 uVar1;
  ImGuiKeyRoutingData *pIVar2;
  undefined8 *in_RSI;
  ImVector<ImGuiKeyRoutingData> *in_RDI;
  ImVector<ImGuiKeyRoutingData> *unaff_retaddr;
  ImVector<ImGuiKeyRoutingData> *pIVar3;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar3 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar3 >> 0x20));
  }
  pIVar2 = in_RDI->Data + in_RDI->Size;
  uVar1 = *in_RSI;
  pIVar2->NextEntryIndex = (short)uVar1;
  pIVar2->Mods = (short)((ulong)uVar1 >> 0x10);
  pIVar2->RoutingNextScore = (char)((ulong)uVar1 >> 0x20);
  *(int3 *)&pIVar2->field_0x5 = (int3)((ulong)uVar1 >> 0x28);
  uVar1 = in_RSI[1];
  pIVar2->RoutingCurr = (int)uVar1;
  pIVar2->RoutingNext = (int)((ulong)uVar1 >> 0x20);
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }